

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O1

void __thiscall ON_Layer::SetPersistentVisibility(ON_Layer *this,bool bVisibleChild)

{
  bool bVar1;
  byte bVar2;
  
  bVar1 = ON_ModelComponent::ParentIdIsNotNil(&this->super_ON_ModelComponent);
  bVar2 = 0;
  if (bVar1) {
    bVar2 = !bVisibleChild * '\x02' + 2;
  }
  this->m_extension_bits = this->m_extension_bits & 0xf9 | bVar2;
  return;
}

Assistant:

void ON_Layer::SetPersistentVisibility(bool bVisibleChild)
{
  const unsigned char and_mask = 0xF9;
  const unsigned char or_bit = ParentIdIsNotNil() 
                             ? (bVisibleChild ? 0x02 : 0x04)
                             : 0x00;
  m_extension_bits &= and_mask;
  m_extension_bits |= or_bit;
}